

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  Type *value_00;
  Type *value_local;
  RepeatedPtrFieldBase *this_local;
  
  if ((this->rep_ == (Rep *)0x0) || (this->current_size_ == this->total_size_)) {
    Reserve(this,this->total_size_ + 1);
    this->rep_->allocated_size = this->rep_->allocated_size + 1;
  }
  else if (this->rep_->allocated_size == this->total_size_) {
    value_00 = cast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                         (this->rep_->elements[this->current_size_]);
    GenericTypeHandler<google::protobuf::MessageLite>::Delete(value_00,this->arena_);
  }
  else if (this->current_size_ < this->rep_->allocated_size) {
    this->rep_->elements[this->rep_->allocated_size] = this->rep_->elements[this->current_size_];
    this->rep_->allocated_size = this->rep_->allocated_size + 1;
  }
  else {
    this->rep_->allocated_size = this->rep_->allocated_size + 1;
  }
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  this->rep_->elements[iVar1] = value;
  return;
}

Assistant:

void RepeatedPtrFieldBase::UnsafeArenaAddAllocated(
    typename TypeHandler::Type* value) {
  // Make room for the new pointer.
  if (!rep_ || current_size_ == total_size_) {
    // The array is completely full with no cleared objects, so grow it.
    Reserve(total_size_ + 1);
    ++rep_->allocated_size;
  } else if (rep_->allocated_size == total_size_) {
    // There is no more space in the pointer array because it contains some
    // cleared objects awaiting reuse.  We don't want to grow the array in this
    // case because otherwise a loop calling AddAllocated() followed by Clear()
    // would leak memory.
    TypeHandler::Delete(
        cast<TypeHandler>(rep_->elements[current_size_]), arena_);
  } else if (current_size_ < rep_->allocated_size) {
    // We have some cleared objects.  We don't care about their order, so we
    // can just move the first one to the end to make space.
    rep_->elements[rep_->allocated_size] = rep_->elements[current_size_];
    ++rep_->allocated_size;
  } else {
    // There are no cleared objects.
    ++rep_->allocated_size;
  }

  rep_->elements[current_size_++] = value;
}